

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,
          vector<mjs::string,_std::allocator<mjs::string>_> *v)

{
  char *pcVar1;
  size_type sVar2;
  wostream *pwVar3;
  const_reference s;
  ulong local_20;
  size_t i;
  vector<mjs::string,_std::allocator<mjs::string>_> *v_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  
  std::operator<<(os,"{");
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<mjs::string,_std::allocator<mjs::string>_>::size(v);
    if (sVar2 <= local_20) break;
    pcVar1 = "\t";
    if (local_20 != 0) {
      pcVar1 = "], ";
    }
    pwVar3 = std::operator<<(os,pcVar1 + 1);
    s = std::vector<mjs::string,_std::allocator<mjs::string>_>::operator[](v,local_20);
    mjs::operator<<(pwVar3,s);
    local_20 = local_20 + 1;
  }
  pwVar3 = std::operator<<(os,"}");
  return pwVar3;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const std::vector<T>& v) {
    os << "{";
    for (size_t i = 0; i < v.size(); ++i) {
        os << (i ? ", " : "") << v[i];
    }
    return os << "}";
}